

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O1

bool __thiscall MetaCommand::Parse(MetaCommand *this,int argc,char **argv)

{
  string *this_00;
  OptionVector *this_01;
  byte bVar1;
  char *pcVar2;
  pointer pFVar3;
  Option *pOVar4;
  pointer pOVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  size_t sVar13;
  Option *pOVar14;
  Option *pOVar15;
  pointer pFVar16;
  ostream *poVar17;
  pointer pOVar18;
  bool bVar19;
  char *__end;
  uint uVar20;
  ulong uVar21;
  char *pcVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  double dVar26;
  double dVar27;
  long local_2a0;
  ulong local_298;
  string tag;
  string completeString;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  char optName [255];
  
  pcVar22 = *argv;
  this_00 = &this->m_ExecutableName;
  pcVar2 = (char *)(this->m_ExecutableName)._M_string_length;
  strlen(pcVar22);
  std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar2,(ulong)pcVar22);
  lVar12 = std::__cxx11::string::find_last_of((char *)this_00,0x16b541,0xffffffffffffffff);
  if (lVar12 != 0) {
    std::__cxx11::string::substr((ulong)optName,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)optName);
    if ((char *)optName._0_8_ != optName + 0x10) {
      operator_delete((void *)optName._0_8_);
    }
  }
  lVar12 = std::__cxx11::string::find_last_of((char *)this_00,0x179326,0xffffffffffffffff);
  if (lVar12 != 0) {
    std::__cxx11::string::substr((ulong)optName,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)optName);
    if ((char *)optName._0_8_ != optName + 0x10) {
      operator_delete((void *)optName._0_8_);
    }
  }
  if (argc == 2) {
    pcVar22 = argv[1];
    iVar10 = strcmp(pcVar22,"-V");
    if ((iVar10 == 0) || (iVar10 = strcmp(pcVar22,"-H"), iVar10 == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage : ",8);
      pcVar22 = *argv;
      if (pcVar22 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
      }
      else {
        sVar13 = strlen(pcVar22);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar22,sVar13);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      ListOptions(this);
      return false;
    }
    iVar10 = strcmp(pcVar22,"-v");
    if ((iVar10 == 0) || (iVar10 = strcmp(pcVar22,"-h"), iVar10 == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage : ",8);
      pcVar22 = *argv;
      if (pcVar22 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
      }
      else {
        sVar13 = strlen(pcVar22);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar22,sVar13);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      ListOptionsSimplified(this);
      return false;
    }
    iVar10 = strcmp(pcVar22,"-vxml");
    if (iVar10 == 0) {
      ListOptionsXML(this);
      return false;
    }
    iVar10 = strcmp(pcVar22,"-version");
    if (iVar10 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Version: ",9);
      pcVar22 = (this->m_Version)._M_dataplus._M_p;
LAB_0011f246:
      poVar17 = std::operator<<((ostream *)&std::cout,pcVar22);
      std::endl<char,std::char_traits<char>>(poVar17);
      return false;
    }
    iVar10 = strcmp(pcVar22,"-date");
    if (iVar10 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Date: ",6);
      pcVar22 = (this->m_Date)._M_dataplus._M_p;
      goto LAB_0011f246;
    }
    iVar10 = strcmp(pcVar22,"-exportGAD");
    if (iVar10 == 0) {
      ExportGAD(this,false);
      return false;
    }
  }
  this_01 = &this->m_ParsedOptionVector;
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::_M_erase_at_end
            (this_01,(this->m_ParsedOptionVector).
                     super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  tag._M_dataplus._M_p = (pointer)&tag.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tag,"","");
  completeString._M_dataplus._M_p = (pointer)&completeString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&completeString,"","");
  if ((uint)argc < 2) {
    bVar8 = true;
    local_2a0 = 0;
    bVar9 = false;
  }
  else {
    uVar21 = 1;
    bVar9 = false;
    bVar1 = 0;
    local_298 = 0;
    local_2a0 = 0;
    lVar12 = 0;
    bVar8 = false;
    do {
      uVar20 = (uint)uVar21;
      pcVar22 = argv[uVar21];
      iVar10 = strcmp(pcVar22,"-exportGAD");
      if (iVar10 == 0) {
        bVar9 = true;
      }
      else {
        if (*pcVar22 == '-') {
          dVar26 = atof(pcVar22);
          if (((dVar26 != 0.0) || (NAN(dVar26))) || (sVar13 = strlen(pcVar22), sVar13 < 2))
          goto LAB_0011e127;
          if (local_298 != 0) {
            if ((bVar1 & 1) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Found tag before end of value list!",0x23);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
              std::ostream::put('h');
              std::ostream::flush();
              goto LAB_0011f167;
            }
            std::__cxx11::string::_M_assign
                      ((string *)
                       (*(long *)&(this->m_OptionVector).
                                  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                  ._M_impl.super__Vector_impl_data._M_start[local_2a0].fields.
                                  super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                  ._M_impl + 0x40));
            pOVar18 = (this->m_OptionVector).
                      super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            *(undefined1 *)
             (*(long *)&pOVar18[local_2a0].fields.
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl + 0xa9) = 1;
            pOVar18[local_2a0].userDefined = true;
            std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
                      (this_01,pOVar18 + local_2a0);
          }
          sVar7 = tag._M_string_length;
          pcVar22 = argv[uVar21];
          strlen(pcVar22);
          std::__cxx11::string::_M_replace((ulong)&tag,0,(char *)sVar7,(ulong)pcVar22);
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,tag._M_dataplus._M_p,
                     tag._M_dataplus._M_p + tag._M_string_length);
          bVar8 = OptionExistsByMinusTag(this,&local_178);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
          }
          if (bVar8) {
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_198,tag._M_dataplus._M_p,
                       tag._M_dataplus._M_p + tag._M_string_length);
            pOVar14 = GetOptionByMinusTag(this,&local_198);
            pFVar16 = (pOVar14->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pFVar3 = (pOVar14->fields).
                     super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b8,tag._M_dataplus._M_p,
                       tag._M_dataplus._M_p + tag._M_string_length);
            pOVar15 = GetOptionByMinusTag(this,&local_1b8);
            pOVar14 = (this->m_OptionVector).
                      super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pOVar4 = (this->m_OptionVector).
                     super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            local_2a0 = -1;
            lVar25 = local_2a0;
            if (pOVar14 != pOVar4) {
              lVar23 = 0;
              do {
                lVar25 = lVar23;
                if (pOVar14 == pOVar15) break;
                lVar23 = lVar23 + 1;
                pOVar14 = pOVar14 + 1;
                lVar25 = local_2a0;
              } while (pOVar14 != pOVar4);
            }
            local_2a0 = lVar25;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p);
            }
            local_298 = ((long)pFVar16 - (long)pFVar3 >> 4) * 0x2e8ba2e8ba2e8ba3;
            if (local_2a0 < 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Error processing tag ",0x15);
              _Var6 = tag._M_dataplus;
              if (tag._M_dataplus._M_p == (pointer)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
              }
              else {
                sVar13 = strlen(tag._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,_Var6._M_p,sVar13);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,".  Tag exists but cannot find its Id.",0x25);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
              std::ostream::put('h');
              bVar8 = true;
              std::ostream::flush();
            }
            else {
              pOVar18 = (this->m_OptionVector).
                        super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar1 = pOVar18[local_2a0].complete;
              lVar25 = *(long *)&pOVar18[local_2a0].fields.
                                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                 ._M_impl;
              bVar8 = true;
              if (*(int *)(lVar25 + 0x60) == 4) {
                uVar20 = uVar20 + 1;
                pcVar22 = argv[uVar20];
                uVar11 = atoi(pcVar22);
                pcVar2 = *(char **)(lVar25 + 0x48);
                strlen(pcVar22);
                std::__cxx11::string::_M_replace(lVar25 + 0x40,0,pcVar2,(ulong)pcVar22);
                if (uVar11 != 0) {
                  uVar21 = 0;
                  do {
                    snprintf(optName,0xff,"%03u",uVar21);
                    pOVar18 = (this->m_OptionVector).
                              super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                    _Var6._M_p = pOVar18[local_2a0].name._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1d8,_Var6._M_p,
                               _Var6._M_p + pOVar18[local_2a0].name._M_string_length);
                    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                    sVar13 = strlen(optName);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1f8,optName,optName + sVar13);
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"","");
                    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"","");
                    AddOptionField(this,&local_1d8,&local_1f8,STRING,true,&local_218,&local_158,
                                   DATA_NONE);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_158._M_dataplus._M_p != &local_158.field_2) {
                      operator_delete(local_158._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_218._M_dataplus._M_p != &local_218.field_2) {
                      operator_delete(local_218._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                      operator_delete(local_1f8._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                      operator_delete(local_1d8._M_dataplus._M_p);
                    }
                    uVar24 = (int)uVar21 + 1;
                    uVar21 = (ulong)uVar24;
                  } while (uVar11 != uVar24);
                }
                local_298 = local_298 + (uVar11 - 1);
              }
              else if (*(int *)(lVar25 + 0x60) == 5) {
                bVar8 = false;
                std::__cxx11::string::_M_replace(lVar25 + 0x40,0,*(char **)(lVar25 + 0x48),0x16a7e5)
                ;
                local_298 = 0;
              }
            }
          }
          else {
            if (this->m_Verbose == true) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The tag ",8)
              ;
              _Var6 = tag._M_dataplus;
              if (tag._M_dataplus._M_p == (pointer)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
              }
              else {
                sVar13 = strlen(tag._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,_Var6._M_p,sVar13);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," is not a valid argument : skipping this tag",0x2c);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
              std::ostream::put('h');
              std::ostream::flush();
            }
            bVar8 = false;
          }
          uVar21 = (ulong)(bVar8 + uVar20);
        }
        else {
LAB_0011e127:
          if (!bVar8) {
            pOVar18 = (this->m_OptionVector).
                      super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pOVar5 = (this->m_OptionVector).
                     super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            bVar8 = pOVar18 == pOVar5;
            if (!bVar8) {
              lVar25 = 0;
              do {
                if ((lVar12 <= lVar25) && ((pOVar18->tag)._M_string_length == 0)) {
                  local_298 = (ulong)(uint)((int)((ulong)((long)(pOVar18->fields).
                                                                                                                                
                                                  super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pOVar18->fields).
                                                                                                                
                                                  super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                           -0x45d1745d);
                  local_2a0 = lVar25;
                  break;
                }
                lVar25 = lVar25 + 1;
                pOVar18 = pOVar18 + 1;
                bVar8 = pOVar18 == pOVar5;
              } while (!bVar8);
            }
            if ((bVar8) && (this->m_Verbose == true)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Too many arguments specified in your command line! "
                         ,0x33);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Skipping extra argument: ",0x19);
              pcVar22 = argv[uVar21];
              if (pcVar22 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
              }
              else {
                sVar13 = strlen(pcVar22);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar22,sVar13);
              }
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
              std::ostream::put('h');
              std::ostream::flush();
            }
            lVar12 = local_2a0 + 1;
            bVar8 = true;
          }
        }
        uVar20 = (uint)uVar21;
        if ((bVar1 & 1) == 0) {
          if (((bVar8 != false) && (uVar20 < (uint)argc)) && (local_298 != 0)) {
            if ((-1 < local_2a0) &&
               (pOVar18 = (this->m_OptionVector).
                          super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                          ._M_impl.super__Vector_impl_data._M_start,
               local_2a0 <
               (int)((ulong)((long)(this->m_OptionVector).
                                   super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar18) >> 7)
               )) {
              lVar25 = *(long *)&pOVar18[local_2a0].fields.
                                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                 ._M_impl;
              pcVar22 = argv[uVar21];
              lVar23 = (((long)*(pointer *)
                                ((long)&pOVar18[local_2a0].fields.
                                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                        ._M_impl + 8) - lVar25 >> 4) * 0x2e8ba2e8ba2e8ba3 -
                       local_298) * 0xb0;
              lVar25 = lVar25 + lVar23;
              pcVar2 = *(char **)(lVar25 + 0x48);
              strlen(pcVar22);
              std::__cxx11::string::_M_replace(lVar25 + 0x40,0,pcVar2,(ulong)pcVar22);
              *(undefined1 *)
               (*(long *)&(this->m_OptionVector).
                          super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_2a0].fields.
                          super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                          ._M_impl + 0xa9 + lVar23) = 1;
            }
            local_298 = local_298 - 1;
          }
        }
        else if (completeString._M_string_length == 0) {
          pcVar22 = argv[uVar21];
          strlen(pcVar22);
          std::__cxx11::string::_M_replace((ulong)&completeString,0,(char *)0x0,(ulong)pcVar22);
        }
        else {
          std::__cxx11::string::append((char *)&completeString);
          std::__cxx11::string::append((char *)&completeString);
        }
        if (local_298 == 0) {
          pOVar18 = (this->m_OptionVector).
                    super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pOVar18[local_2a0].userDefined = true;
          std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
                    (this_01,pOVar18 + local_2a0);
          bVar8 = false;
          local_298 = 0;
        }
      }
      uVar21 = (ulong)(uVar20 + 1);
    } while (uVar20 + 1 < (uint)argc);
    bVar8 = local_298 == 0;
  }
  if (bVar8) {
    pOVar18 = (this->m_OptionVector).
              super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pOVar18 !=
        (this->m_OptionVector).
        super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar8 = false;
      do {
        if (pOVar18->required == true) {
          if (pOVar18->userDefined == false) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Option ",7);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(pOVar18->name)._M_dataplus._M_p,
                                 (pOVar18->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17," is required but not defined",0x1c);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
            std::ostream::put((char)poVar17);
            bVar8 = true;
            std::ostream::flush();
          }
          else {
            pFVar16 = (pOVar18->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pFVar3 = (pOVar18->fields).
                     super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (pFVar16 != pFVar3) {
              bVar19 = true;
              do {
                if ((pFVar16->value)._M_string_length == 0) {
                  bVar19 = false;
                }
                pFVar16 = pFVar16 + 1;
              } while (pFVar16 != pFVar3);
              if (!bVar19) {
                if ((pOVar18->tag)._M_string_length == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Field ",6);
                  pcVar22 = (pOVar18->name)._M_dataplus._M_p;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Field ",6);
                  pcVar22 = (pOVar18->tag)._M_dataplus._M_p;
                }
                if (pcVar22 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
                }
                else {
                  sVar13 = strlen(pcVar22);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar22,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout," is required but not defined",0x1c);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
                std::ostream::put('h');
                bVar8 = true;
                std::ostream::flush();
              }
            }
          }
        }
        pOVar18 = pOVar18 + 1;
      } while (pOVar18 !=
               (this->m_OptionVector).
               super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl
               .super__Vector_impl_data._M_finish);
      if (bVar8) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Command: ",9);
        pcVar22 = *argv;
        if (pcVar22 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
        }
        else {
          sVar13 = strlen(pcVar22);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar22,sVar13);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"Options: ",9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,"  -v or -h for help listed in short format",0x2a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,"  -V or -H for help listed in long format",0x29);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,"  -vxml for help listed in xml format",0x25);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,"  -export-gad to export Grid Application",0x28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"Description file format",0x17);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        goto LAB_0011f167;
      }
    }
    pOVar18 = (this->m_ParsedOptionVector).
              super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pOVar18 ==
        (this->m_ParsedOptionVector).
        super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar8 = true;
      if (!bVar9) goto LAB_0011f16a;
    }
    else {
      bVar8 = true;
      do {
        for (pFVar16 = (pOVar18->fields).
                       super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pFVar16 !=
            (pOVar18->fields).
            super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
            super__Vector_impl_data._M_finish; pFVar16 = pFVar16 + 1) {
          if ((pFVar16->type < STRING) && ((pFVar16->value)._M_string_length != 0)) {
            if ((pFVar16->rangeMin)._M_string_length == 0) {
LAB_0011ebd2:
              if ((pFVar16->rangeMax)._M_string_length != 0) {
                dVar26 = atof((pFVar16->rangeMax)._M_dataplus._M_p);
                dVar27 = atof((pFVar16->value)._M_dataplus._M_p);
                if (dVar26 < dVar27) goto LAB_0011ec07;
              }
            }
            else {
              dVar26 = atof((pFVar16->rangeMin)._M_dataplus._M_p);
              dVar27 = atof((pFVar16->value)._M_dataplus._M_p);
              if (dVar26 <= dVar27) goto LAB_0011ebd2;
LAB_0011ec07:
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(pOVar18->name)._M_dataplus._M_p,
                                   (pOVar18->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,".",1);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar17,(pFVar16->name)._M_dataplus._M_p,
                                   (pFVar16->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," : Value (",10);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar17,(pFVar16->value)._M_dataplus._M_p,
                                   (pFVar16->value)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,") ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,"is not in the range [",0x15);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar17,(pFVar16->rangeMin)._M_dataplus._M_p,
                                   (pFVar16->rangeMin)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar17,(pFVar16->rangeMax)._M_dataplus._M_p,
                                   (pFVar16->rangeMax)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"]",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
              std::ostream::put((char)poVar17);
              std::ostream::flush();
              bVar8 = false;
            }
          }
        }
        pOVar18 = pOVar18 + 1;
      } while (pOVar18 !=
               (this->m_ParsedOptionVector).
               super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl
               .super__Vector_impl_data._M_finish);
      if ((bVar9 & bVar8) == 0) goto LAB_0011f16a;
    }
    ExportGAD(this,true);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Not enough parameters for ",0x1a);
    pOVar18 = (this->m_OptionVector).
              super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
              super__Vector_impl_data._M_start;
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pOVar18[local_2a0].name._M_dataplus._M_p,
                         pOVar18[local_2a0].name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Command: ",9);
    pcVar22 = *argv;
    if (pcVar22 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
    }
    else {
      sVar13 = strlen(pcVar22);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar22,sVar13);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Options: ",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    poVar17 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"  -v or -h for help listed in short format",0x2a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    poVar17 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"  -V or -H for help listed in long format",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    poVar17 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"  -vxml for help listed in xml format",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    poVar17 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"  -export-gad to export Grid Application",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"Description file format",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
  }
LAB_0011f167:
  bVar8 = false;
LAB_0011f16a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)completeString._M_dataplus._M_p != &completeString.field_2) {
    operator_delete(completeString._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tag._M_dataplus._M_p != &tag.field_2) {
    operator_delete(tag._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool MetaCommand::Parse(int argc, const char* argv[])
{
  m_ExecutableName = argv[0];

  size_t slash = m_ExecutableName.find_last_of("/");
  if(slash>0)
    {
    m_ExecutableName = m_ExecutableName.substr(slash+1,m_ExecutableName.size()-slash-1);
    }
  slash = m_ExecutableName.find_last_of("\\");
  if(slash>0)
    {
    m_ExecutableName = m_ExecutableName.substr(slash+1,m_ExecutableName.size()-slash-1);
    }

  // List the options if using -V
  if((argc == 2 && !strcmp(argv[1],"-V"))
     || (argc == 2 && !strcmp(argv[1],"-H")))
    {
    METAIO_STREAM::cout << "Usage : " << argv[0] << METAIO_STREAM::endl;
    this->ListOptions();
    return false;
    }
  // List the options if using -v
  else if((argc == 2 && !strcmp(argv[1],"-v"))
          || (argc == 2 && !strcmp(argv[1],"-h")))
    {
    METAIO_STREAM::cout << "Usage : " << argv[0] << METAIO_STREAM::endl;
    this->ListOptionsSimplified();
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-vxml"))
    {
    this->ListOptionsXML();
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-version"))
    {
    METAIO_STREAM::cout << "Version: " << m_Version.c_str() << METAIO_STREAM::endl;
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-date"))
    {
    METAIO_STREAM::cout << "Date: " << m_Date.c_str() << METAIO_STREAM::endl;
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-exportGAD"))
    {
    this->ExportGAD();
    return false;
    }

  // Fill in the results
  m_ParsedOptionVector.clear();
  bool inArgument = false;
  METAIO_STL::string tag = "";

  long currentField = 0; // current field position
  long currentOption = 0; // id of the option to fill
  size_t valuesRemaining=0;
  bool isComplete = false; // check if the option should be parse until the next tag is found
  METAIO_STL::string completeString = "";

  bool exportGAD = false;

  for(unsigned int i=1; i<(unsigned int)argc; ++i)
    {
    // If we have the tag -export-gad
    if(!strcmp(argv[i],"-exportGAD"))
      {
      exportGAD = true;
      continue;
      }

    // If this is a tag
    if(argv[i][0] == '-' && (atof(argv[i])==0) && (strlen(argv[i])>1))
      {
      // if we have a tag before the expected values we throw an exception
      if(valuesRemaining != 0)
        {
        if(!isComplete)
          {
          METAIO_STREAM::cout << "Found tag before end of value list!" << METAIO_STREAM::endl;
          return false;
          }
        else
          {
          m_OptionVector[currentOption].fields[0].value = completeString;
          m_OptionVector[currentOption].fields[0].userDefined = true;
          m_OptionVector[currentOption].userDefined = true;
          m_ParsedOptionVector.push_back(m_OptionVector[currentOption]);
          }
        }
      inArgument = false;
      // New tag so we add the previous values to the tag
      tag = argv[i];

      // Check if the tag is in the list
      if(this->OptionExistsByMinusTag(tag))
        {
        inArgument = true;
        valuesRemaining = this->GetOptionByMinusTag(tag)->fields.size();
        currentOption = this->GetOptionId(this->GetOptionByMinusTag(tag));

        if(currentOption < 0)
          {
          METAIO_STREAM::cout << "Error processing tag " << tag.c_str()
                    << ".  Tag exists but cannot find its Id."
                    << METAIO_STREAM::endl;
          }
        else
          {
          isComplete = m_OptionVector[currentOption].complete;

          if(m_OptionVector[currentOption].fields[0].type == FLAG)
            {
            // the tag exists by default
            m_OptionVector[currentOption].fields[0].value = "true";
            valuesRemaining = 0;
            inArgument = false;
            }
          else if(m_OptionVector[currentOption].fields[0].type == LIST)
            {
            inArgument = true;
            unsigned int valuesInList = (int)atoi(argv[++i]);
            m_OptionVector[currentOption].fields[0].value = argv[i];
            valuesRemaining += valuesInList-1;
            char optName[255];
            for(unsigned int j=0; j<valuesInList; j++)
              {
              snprintf(optName, sizeof(optName), "%03u", j);
              this->AddOptionField( m_OptionVector[currentOption].name,
                                    optName, STRING );
              }
            }
          }
        }
      else if(m_Verbose)
        {
        METAIO_STREAM::cout << "The tag " << tag.c_str()
                  << " is not a valid argument : skipping this tag"
                  << METAIO_STREAM::endl;
        }
      if(inArgument)
        {
        ++i;
        }
      }
    else if(!inArgument) // If this is a field
      {
      // Look for the field to add
      auto it = m_OptionVector.begin();
      long pos = 0;
      bool found = false;
      while(it != m_OptionVector.end())
        {
        if ((pos >= currentField) && ((*it).tag.empty())) {
          currentOption = pos;
          valuesRemaining = static_cast<unsigned int>((*it).fields.size());
          found = true;
          break;
        }
        ++pos;
        ++it;
        }

      if(!found && m_Verbose)
        {
        METAIO_STREAM::cout << "Too many arguments specified in your command line! "
                  << "Skipping extra argument: " << argv[i] << METAIO_STREAM::endl;
        }

      inArgument=true;
      currentField=currentOption+1;
      }

    // We collect the values
    if(isComplete)
      {
      if (completeString.empty()) {
        completeString = argv[i];
      } else {
        completeString += " ";
        completeString += argv[i];
      }
      }
    else if(inArgument && i<(unsigned int)argc && valuesRemaining>0)
      {
      if(currentOption >=0 && currentOption < (int)(m_OptionVector.size()))
        {
        auto s = static_cast<unsigned long>(
            m_OptionVector[currentOption].fields.size());
        m_OptionVector[currentOption].fields[s-valuesRemaining].value = argv[i];
        m_OptionVector[currentOption].fields[s-valuesRemaining].userDefined =
                                                                           true;
        }
      --valuesRemaining;
      }

    if(valuesRemaining == 0)
      {
      inArgument = false;
      m_OptionVector[currentOption].userDefined = true;
      m_ParsedOptionVector.push_back(m_OptionVector[currentOption]);
      }
    }

  if(valuesRemaining > 0)
    {
    METAIO_STREAM::cout << "Not enough parameters for "
              << m_OptionVector[currentOption].name << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "Command: " << argv[0] << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "Options: " << METAIO_STREAM::endl
              << "  -v or -h for help listed in short format" << METAIO_STREAM::endl
              << "  -V or -H for help listed in long format" << METAIO_STREAM::endl
              << "  -vxml for help listed in xml format" << METAIO_STREAM::endl
              << "  -export-gad to export Grid Application"
              << "Description file format" << METAIO_STREAM::endl;

    return false;
    }

  // Check if the options with required arguments are defined
    auto it = m_OptionVector.begin();
    bool requiredAndNotDefined = false;
    while (it != m_OptionVector.end()) {
      if ((*it).required) {
        // First check if the option is actually defined
        if (!(*it).userDefined) {
          METAIO_STREAM::cout << "Option " << (*it).name
                              << " is required but not defined"
                              << METAIO_STREAM::endl;
          requiredAndNotDefined = true;
          ++it;
          continue;
        }

      // Check if the values are defined
      METAIO_STL::vector<Field>::const_iterator itFields = (*it).fields.begin();
      bool defined = true;
      while(itFields != (*it).fields.end())
        {
        if ((*itFields).value.empty()) {
          defined = false;
        }
        ++itFields;
        }

      if(!defined)
        {
        if (!(*it).tag.empty()) {
          METAIO_STREAM::cout << "Field " << (*it).tag.c_str()
                    << " is required but not defined" << METAIO_STREAM::endl;
        } else {
          METAIO_STREAM::cout << "Field " << (*it).name.c_str()
                    << " is required but not defined" << METAIO_STREAM::endl;
        }
        requiredAndNotDefined = true;
        }
      }
    ++it;
    }

  if(requiredAndNotDefined)
    {
    METAIO_STREAM::cout << "Command: " << argv[0] << METAIO_STREAM::endl
              << "Options: " << METAIO_STREAM::endl
              << "  -v or -h for help listed in short format" << METAIO_STREAM::endl
              << "  -V or -H for help listed in long format" << METAIO_STREAM::endl
              << "  -vxml for help listed in xml format" << METAIO_STREAM::endl
              << "  -export-gad to export Grid Application"
              << "Description file format" << METAIO_STREAM::endl;
    return false;
    }

  // Check if the values are in range (if the range is defined)
    auto itParsed = m_ParsedOptionVector.begin();
    bool valueInRange = true;
    while (itParsed != m_ParsedOptionVector.end()) {
      METAIO_STL::vector<Field>::const_iterator itFields =
          (*itParsed).fields.begin();
      while (itFields != (*itParsed).fields.end()) {
        // Check only if this is a number
        if (((*itFields).type == INT || (*itFields).type == FLOAT ||
             (*itFields).type == CHAR) &&
            (!(*itFields).value.empty())) {
          // Check the range min
          if (((!(*itFields).rangeMin.empty()) &&
               (atof((*itFields).rangeMin.c_str()) >
                atof((*itFields).value.c_str()))) ||
              ((!(*itFields).rangeMax.empty()) &&
               (atof((*itFields).rangeMax.c_str()) <
                atof((*itFields).value.c_str())))) {
            METAIO_STREAM::cout
                << (*itParsed).name << "." << (*itFields).name << " : Value ("
                << (*itFields).value << ") "
                << "is not in the range [" << (*itFields).rangeMin << ","
                << (*itFields).rangeMax << "]" << METAIO_STREAM::endl;
            valueInRange = false;
          }
        }
        ++itFields;
      }
    ++itParsed;
    }

  if(!valueInRange)
    {
    return false;
    }

  // If everything is ok
  if(exportGAD)
    {
    this->ExportGAD(true);
    return false; // prevent from running the application
    }

  return true;
}